

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O3

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL3SLDropSetEnhER0Test
          (DatarateTestSVC *this)

{
  double *val1;
  bool bVar1;
  int iVar2;
  ParamType *pPVar3;
  ostream *poVar4;
  int i;
  uint uVar5;
  uint uVar6;
  undefined8 *puVar7;
  SEARCH_METHODS *pSVar8;
  long lVar9;
  long lVar10;
  AssertHelper local_d0;
  AssertHelper local_c8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int local_9c;
  double *local_98;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv","");
  libaom_test::YUVVideoSource::YUVVideoSource
            (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
             0x160,0x120,0x1e,1,0,300);
  video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__YUVVideoSource_01003b10;
  if ((TestPartResultReporterInterface **)
      gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
    operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface);
  }
  pPVar3 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c4f6f0 +
                (long)(pPVar3->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  local_9c = 0x96;
  uVar5 = 0x65;
  iVar2 = 0;
  do {
    if ((uVar5 & 3) != 0) {
      this->drop_frames_list_[iVar2] = uVar5;
      iVar2 = iVar2 + 1;
      local_9c = local_9c - (uVar5 & 1);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 200);
  this->number_temporal_layers_ = 3;
  this->number_spatial_layers_ = 3;
  this->multi_ref_ = 1;
  this->drop_frames_ = iVar2 * 3;
  uVar5 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->target_layer_bitrate_[0] = uVar5 >> 4;
  this->target_layer_bitrate_[1] = ((uVar5 >> 3) * 0x46) / 100;
  this->target_layer_bitrate_[2] = uVar5 >> 3;
  uVar6 = uVar5 * 3 >> 3;
  this->target_layer_bitrate_[3] = uVar5 * 3 >> 4;
  this->target_layer_bitrate_[4] = (uVar6 * 0x46) / 100;
  this->target_layer_bitrate_[5] = uVar6;
  uVar5 = uVar5 >> 1 & 0x1fffffff;
  this->target_layer_bitrate_[6] = uVar5 >> 1;
  this->target_layer_bitrate_[7] = (uVar5 * 0x46) / 100;
  this->target_layer_bitrate_[8] = uVar5;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&video);
    }
    bVar1 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar1 == false) {
      if (0 < this->number_spatial_layers_ * this->number_temporal_layers_) {
        local_98 = this->effective_datarate_tl;
        lVar9 = 0;
        lVar10 = 0;
        do {
          val1 = (double *)((long)local_98 + lVar9);
          local_d0.data_ =
               (AssertHelperData *)((double)*(int *)((long)local_98 + lVar10 * 4 + -0x2b8) * 0.6);
          testing::internal::CmpHelperGE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 0.60",val1,(double *)&local_d0);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_d0.data_)->line,
                       " The datarate for the file is lower than target by too much!",0x3c);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar8 = "";
            }
            else {
              pSVar8 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0xa8f,(char *)pSVar8);
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_c8);
            if (local_d0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            puVar7 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar7 == (undefined8 *)0x0) goto LAB_0060c456;
            if ((undefined8 *)*puVar7 != puVar7 + 2) {
              operator_delete((undefined8 *)*puVar7);
            }
            goto LAB_0060c44e;
          }
          puVar7 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar7 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar7 != puVar7 + 2) {
              operator_delete((undefined8 *)*puVar7);
            }
            operator_delete(puVar7);
          }
          local_d0.data_ =
               (AssertHelperData *)((double)*(int *)((long)local_98 + lVar10 * 4 + -0x2b8) * 1.6);
          testing::internal::CmpHelperLE<double,double>
                    ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 1.60",val1,(double *)&local_d0);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_d0.data_)->line,
                       " The datarate for the file is greater than target by too much!",0x3e);
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
              pSVar8 = "";
            }
            else {
              pSVar8 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0xa91,(char *)pSVar8);
            testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper(&local_c8);
            if (local_d0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_d0.data_ + 8))();
            }
            puVar7 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar7 == (undefined8 *)0x0) goto LAB_0060c456;
            if ((undefined8 *)*puVar7 != puVar7 + 2) {
              operator_delete((undefined8 *)*puVar7);
            }
            goto LAB_0060c44e;
          }
          puVar7 = (undefined8 *)
                   CONCAT71(gtest_fatal_failure_checker._9_7_,
                            gtest_fatal_failure_checker.has_new_fatal_failure_);
          if (puVar7 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar7 != puVar7 + 2) {
              operator_delete((undefined8 *)*puVar7);
            }
            operator_delete(puVar7);
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 8;
        } while (lVar10 < (long)this->number_spatial_layers_ * (long)this->number_temporal_layers_);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"          Decoded frames: ",0x1a);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"          Mismatch frames: ",0x1b);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      local_d0.data_._0_4_ = this->number_spatial_layers_ * 300 - this->decoded_nframes_;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_fatal_failure_checker,
                 "300 * number_spatial_layers_ - GetDecodedFrames()","drop_frames_",
                 (uint *)&local_d0,&this->drop_frames_);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_d0);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                   ,0xa98,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_d0.data_ + 8))();
        }
      }
      puVar7 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar7 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar7 != puVar7 + 2) {
          operator_delete((undefined8 *)*puVar7);
        }
        operator_delete(puVar7);
      }
      local_d0.data_._0_4_ = this->mismatch_nframes_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_fatal_failure_checker,"(int)GetMismatchFrames()","num_nonref",
                 (int *)&local_d0,&local_9c);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_d0);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar8 = "";
        }
        else {
          pSVar8 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                   ,0xa99,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_d0.data_ + 8))();
        }
      }
      puVar7 = (undefined8 *)
               CONCAT71(gtest_fatal_failure_checker._9_7_,
                        gtest_fatal_failure_checker.has_new_fatal_failure_);
      if (puVar7 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar7 != puVar7 + 2) {
          operator_delete((undefined8 *)*puVar7);
        }
LAB_0060c44e:
        operator_delete(puVar7);
      }
      goto LAB_0060c456;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0xa8d,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_0060c456:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLDropSetEnhER0Test() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, 300);
    const int bitrate_array[2] = { 200, 550 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    // Set error_resilience off.
    cfg_.g_error_resilient = 0;
    // Drop TL1 and TL2: for part of sequence. Start at first TL2 at
    // frame 101, and end at second T2 at frame 199. Frame 200 is TL0,
    // so we can continue decoding without mismatch (since LAST is the
    // only reference).
    // Drop here means drop whole superframe.
    int n = 0;
#if CONFIG_AV1_DECODER
    int num_nonref = 300 / 2;
#endif
    for (int i = 101; i < 200; i++) {
      if (i % 4 != 0) {
        drop_frames_list_[n] = i;
        n++;
#if CONFIG_AV1_DECODER
        if (i % 2 != 0) num_nonref -= 1;
#endif
      }
    }
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    multi_ref_ = 1;
    drop_frames_ = n * number_spatial_layers_;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.60)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.60)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Test that no mismatches have been found.
    std::cout << "          Decoded frames: " << GetDecodedFrames() << "\n";
    std::cout << "          Mismatch frames: " << GetMismatchFrames() << "\n";
    EXPECT_EQ(300 * number_spatial_layers_ - GetDecodedFrames(), drop_frames_);
    EXPECT_EQ((int)GetMismatchFrames(), num_nonref);
#endif
  }